

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonehash.cpp
# Opt level: O1

void __thiscall
asmjit::ZoneHashBase::_rehash(ZoneHashBase *this,ZoneAllocator *allocator,uint32_t primeIndex)

{
  byte bVar1;
  uint uVar2;
  ZoneHashNode **ppZVar3;
  ZoneHashNode *pZVar4;
  ZoneHashNode *pZVar5;
  uint uVar6;
  ZoneHashNode **ppZVar7;
  ulong uVar8;
  ZoneHashNode *extraout_RDX;
  ZoneHashBase *pZVar9;
  ZoneHashBase *this_00;
  uint uVar10;
  size_t local_38;
  
  if (primeIndex < 0x81) {
    this_00 = this;
    if (allocator->_zone == (Zone *)0x0) goto LAB_00125278;
    uVar8 = (ulong)primeIndex;
    uVar6 = *(uint *)(ZoneHash_primeArray + uVar8 * 8);
    ppZVar3 = this->_data;
    ppZVar7 = (ZoneHashNode **)ZoneAllocator::_allocZeroed(allocator,(ulong)uVar6 * 8,&local_38);
    if (ppZVar7 == (ZoneHashNode **)0x0) {
      return;
    }
    this_00 = (ZoneHashBase *)(ulong)this->_bucketsCount;
    this->_data = ppZVar7;
    this->_bucketsCount = uVar6;
    this->_bucketsGrow = (uint32_t)(long)((double)uVar6 * 0.9);
    uVar2 = *(uint *)(ZoneHash_primeArray + uVar8 * 8 + 4);
    this->_rcpValue = uVar2;
    bVar1 = ZoneHash_primeShift[uVar8];
    this->_rcpShift = bVar1;
    this->_primeIndex = (uint8_t)primeIndex;
    if (this_00 != (ZoneHashBase *)0x0) {
      pZVar9 = (ZoneHashBase *)0x0;
      do {
        pZVar5 = ppZVar3[(long)pZVar9];
        while (pZVar5 != (ZoneHashNode *)0x0) {
          pZVar4 = *(ZoneHashNode **)pZVar5;
          uVar10 = *(uint *)(pZVar5 + 8) -
                   (int)((ulong)*(uint *)(pZVar5 + 8) * (ulong)uVar2 >> (bVar1 & 0x3f)) * uVar6;
          *(ZoneHashNode **)pZVar5 = ppZVar7[uVar10];
          ppZVar7[uVar10] = pZVar5;
          pZVar5 = pZVar4;
        }
        pZVar9 = (ZoneHashBase *)((long)&pZVar9->_data + 1);
      } while (pZVar9 != this_00);
    }
    if (ppZVar3 == this->_embedded) {
      return;
    }
    if (allocator->_zone == (Zone *)0x0) goto LAB_0012527d;
    if (ppZVar3 != (ZoneHashNode **)0x0) {
      if (this_00 != (ZoneHashBase *)0x0) {
        _rehash();
        return;
      }
      goto LAB_00125287;
    }
  }
  else {
    _rehash();
    this_00 = this;
LAB_00125278:
    _rehash();
LAB_0012527d:
    _rehash();
  }
  _rehash();
LAB_00125287:
  _rehash();
  uVar6 = *(uint *)(extraout_RDX + 8) -
          (int)((ulong)this_00->_rcpValue * (ulong)*(uint *)(extraout_RDX + 8) >>
               (this_00->_rcpShift & 0x3f)) * this_00->_bucketsCount;
  ppZVar3 = this_00->_data;
  *(ZoneHashNode **)extraout_RDX = ppZVar3[uVar6];
  ppZVar3[uVar6] = extraout_RDX;
  uVar8 = this_00->_size + 1;
  this_00->_size = uVar8;
  if (this_00->_bucketsGrow < uVar8) {
    bVar1 = this_00->_primeIndex;
    uVar6 = 0x7e;
    if (bVar1 < 0x7e) {
      uVar6 = (uint)bVar1;
    }
    if ((uint)bVar1 < uVar6 + 2) {
      _rehash(this_00,allocator,uVar6 + 2);
    }
  }
  return;
}

Assistant:

void ZoneHashBase::_rehash(ZoneAllocator* allocator, uint32_t primeIndex) noexcept {
  ASMJIT_ASSERT(primeIndex < ASMJIT_ARRAY_SIZE(ZoneHash_primeArray));
  uint32_t newCount = ZoneHash_primeArray[primeIndex].prime;

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    allocator->allocZeroed(size_t(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  _data = newData;
  _bucketsCount = newCount;
  _bucketsGrow = uint32_t(newCount * 0.9);
  _rcpValue = ZoneHash_primeArray[primeIndex].rcp;
  _rcpShift = ZoneHash_primeShift[primeIndex];
  _primeIndex = uint8_t(primeIndex);

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hashMod = _calcMod(node->_hashCode);

      node->_hashNext = newData[hashMod];
      newData[hashMod] = node;
      node = next;
    }
  }

  if (oldData != _embedded)
    allocator->release(oldData, oldCount * sizeof(ZoneHashNode*));
}